

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall
flatbuffers::anon_unknown_0::atot<signed_char>
          (anon_unknown_0 *this,char *s,Parser *parser,char *val)

{
  bool bVar1;
  undefined7 extraout_var;
  long *plVar2;
  undefined8 *puVar3;
  long *extraout_RAX;
  long *plVar4;
  ulong *puVar5;
  ulong uVar6;
  allocator<char> local_e9;
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 uStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  long *local_48 [2];
  long local_38 [2];
  
  bVar1 = StringToNumber<signed_char>(s,val);
  plVar2 = (long *)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    *(undefined2 *)this = 0;
    goto LAB_001117bf;
  }
  if (*val == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,s,(allocator<char> *)&local_68);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x153281);
    puVar5 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar5) {
      local_b8 = *puVar5;
      lStack_b0 = plVar2[3];
      local_c8 = &local_b8;
    }
    else {
      local_b8 = *puVar5;
      local_c8 = (ulong *)*plVar2;
    }
    local_c0 = plVar2[1];
    *plVar2 = (long)puVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_d8 = *plVar2;
      uStack_d0 = puVar3[3];
      local_e8 = &local_d8;
    }
    else {
      local_d8 = *plVar2;
      local_e8 = (long *)*puVar3;
    }
    local_e0 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    Parser::Error((Parser *)this,(string *)parser);
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8 + 1);
    }
    plVar2 = &local_98;
    local_38[0] = local_98;
    local_48[0] = local_a8;
    if (local_a8 == plVar2) goto LAB_001117bf;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,s,&local_e9);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x153281);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_58 = *plVar4;
      lStack_50 = plVar2[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar4;
      local_68 = (long *)*plVar2;
    }
    local_60 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_68);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_98 = *plVar4;
      lStack_90 = plVar2[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *plVar4;
      local_a8 = (long *)*plVar2;
    }
    local_a0 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_a8);
    puVar5 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar5) {
      local_b8 = *puVar5;
      lStack_b0 = plVar2[3];
      local_c8 = &local_b8;
    }
    else {
      local_b8 = *puVar5;
      local_c8 = (ulong *)*plVar2;
    }
    local_c0 = plVar2[1];
    *plVar2 = (long)puVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    TypeToIntervalString<signed_char>();
    uVar6 = 0xf;
    if (local_c8 != &local_b8) {
      uVar6 = local_b8;
    }
    if (uVar6 < (ulong)(local_80 + local_c0)) {
      uVar6 = 0xf;
      if (local_88 != local_78) {
        uVar6 = local_78[0];
      }
      if (uVar6 < (ulong)(local_80 + local_c0)) goto LAB_001115d6;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_c8);
    }
    else {
LAB_001115d6:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_88);
    }
    local_e8 = &local_d8;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_d8 = *plVar2;
      uStack_d0 = puVar3[3];
    }
    else {
      local_d8 = *plVar2;
      local_e8 = (long *)*puVar3;
    }
    local_e0 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)plVar2 = 0;
    Parser::Error((Parser *)this,(string *)parser);
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if (local_88 != local_78) {
      operator_delete(local_88,local_78[0] + 1);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8 + 1);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98 + 1);
    }
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    plVar2 = local_38;
    if (local_48[0] == plVar2) goto LAB_001117bf;
  }
  operator_delete(local_48[0],local_38[0] + 1);
  plVar2 = extraout_RAX;
LAB_001117bf:
  return SUB82(plVar2,0);
}

Assistant:

static CheckedError atot(const char *s, Parser &parser, T *val) {
  auto done = atot_scalar(s, val, bool_constant<is_floating_point<T>::value>());
  if (done) return NoError();
  if (0 == *val)
    return parser.Error("invalid number: \"" + std::string(s) + "\"");
  else
    return parser.Error("invalid number: \"" + std::string(s) + "\"" +
                        ", constant does not fit " + TypeToIntervalString<T>());
}